

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdftocsv.cpp
# Opt level: O1

bool cdftocsv::getrec(char *rec_,FILE *stream,int recsize_)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  while ((iVar2 != recsize_ && (iVar1 = getc((FILE *)stream), iVar1 != -1))) {
    *rec_ = (char)iVar1;
    iVar2 = iVar2 + 1;
    rec_ = rec_ + 1;
  }
  return iVar2 == recsize_;
}

Assistant:

bool getrec(char *rec_, FILE *stream, int recsize_)
	{
		int totalread = 0;
		while (totalread != recsize_) {
			int ch = getc(stream);
			if (ch == EOF) {
				return false;
			}
			*rec_ = ch;
			totalread++;
			rec_++;
		}

		return true;

	}